

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking64.h
# Opt level: O3

void packforblock15_64(uint64_t base,uint64_t **pin,uint8_t **pw)

{
  ulong *puVar1;
  uint64_t *puVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  uint64_t uVar19;
  uint64_t uVar20;
  uint64_t uVar21;
  uint64_t uVar22;
  uint64_t uVar23;
  uint64_t uVar24;
  uint64_t uVar25;
  uint64_t uVar26;
  uint64_t uVar27;
  uint64_t uVar28;
  uint64_t uVar29;
  uint64_t uVar30;
  int iVar31;
  
  iVar31 = (int)base;
  puVar1 = (ulong *)*pw;
  puVar2 = *pin;
  uVar3 = puVar2[4];
  uVar4 = puVar2[5];
  uVar5 = puVar2[6];
  uVar24 = puVar2[7];
  uVar6 = puVar2[8];
  uVar7 = puVar2[9];
  uVar8 = puVar2[10];
  uVar25 = puVar2[0xb];
  uVar9 = puVar2[0xc];
  uVar10 = puVar2[0xd];
  uVar11 = puVar2[0xe];
  uVar26 = puVar2[0xf];
  uVar27 = puVar2[0x10];
  uVar12 = puVar2[0x11];
  uVar13 = puVar2[0x12];
  uVar14 = puVar2[0x13];
  uVar28 = puVar2[0x14];
  uVar15 = puVar2[0x15];
  uVar16 = puVar2[0x16];
  uVar17 = puVar2[0x17];
  uVar29 = puVar2[0x18];
  uVar18 = puVar2[0x19];
  uVar19 = puVar2[0x1a];
  uVar20 = puVar2[0x1b];
  uVar30 = puVar2[0x1c];
  uVar21 = puVar2[0x1d];
  uVar22 = puVar2[0x1e];
  uVar23 = puVar2[0x1f];
  *puVar1 = uVar3 - base << 0x3c |
            (ulong)(uint)((int)puVar2[3] - iVar31) << 0x2d | (puVar2[2] - base) * 0x40000000 |
            (puVar2[1] - base) * 0x8000 | *puVar2 - base;
  puVar1[1] = uVar6 - base << 0x38 |
              (ulong)(uint)((int)uVar24 - iVar31) << 0x29 | (uVar5 - base) * 0x4000000 |
              (uVar4 - base) * 0x800 | uVar3 - base >> 4;
  puVar1[2] = uVar9 - base << 0x34 |
              (ulong)(uint)((int)uVar25 - iVar31) << 0x25 | (uVar8 - base) * 0x400000 |
              (uVar7 - base) * 0x80 | uVar6 - base >> 8;
  puVar1[3] = uVar12 - base << 0x3f | (ulong)(uint)((int)uVar27 - iVar31) << 0x30 |
              (ulong)(uint)((int)uVar26 - iVar31) << 0x21 | (uVar11 - base) * 0x40000 |
              (uVar10 - base) * 8 | uVar9 - base >> 0xc;
  puVar1[4] = uVar15 - base << 0x3b |
              (ulong)(uint)((int)uVar28 - iVar31) << 0x2c | (uVar14 - base) * 0x20000000 |
              (uVar13 - base) * 0x4000 | uVar12 - base >> 1;
  puVar1[5] = uVar18 - base << 0x37 |
              (ulong)(uint)((int)uVar29 - iVar31) << 0x28 | (uVar17 - base) * 0x2000000 |
              (uVar16 - base) * 0x400 | uVar15 - base >> 5;
  puVar1[6] = uVar21 - base << 0x33 |
              (ulong)(uint)((int)uVar30 - iVar31) << 0x24 | (uVar20 - base) * 0x200000 |
              (uVar19 - base) * 0x40 | uVar18 - base >> 9;
  puVar1[7] = (uVar23 - base) * 0x20000 | (uVar22 - base) * 4 | uVar21 - base >> 0xd;
  *pin = puVar2 + 0x20;
  *pw = *pw + 0x3c;
  return;
}

Assistant:

static void packforblock15_64(const uint64_t base, const uint64_t ** pin, uint8_t ** pw) {
  uint64_t * pw64 = *(uint64_t **) pw;
  const uint64_t * in = *pin;
  /* we are going to touch  8 64-bit words */ 
  uint64_t w0;
  uint64_t w1;
  uint64_t w2;
  uint64_t w3;
  uint64_t w4;
  uint64_t w5;
  uint64_t w6;
  uint64_t w7;
  w0 = (in[0] - base);
  w0 |=  (in[1] - base) << 15;
  w0 |=  (in[2] - base) << 30;
  w0 |=  (in[3] - base) << 45;
  w0 |= (in[4] - base) << 60;
  w1 = (in[4] - base) >> 4;
  w1 |=  (in[5] - base) << 11;
  w1 |=  (in[6] - base) << 26;
  w1 |=  (in[7] - base) << 41;
  w1 |= (in[8] - base) << 56;
  w2 = (in[8] - base) >> 8;
  w2 |=  (in[9] - base) << 7;
  w2 |=  (in[10] - base) << 22;
  w2 |=  (in[11] - base) << 37;
  w2 |= (in[12] - base) << 52;
  w3 = (in[12] - base) >> 12;
  w3 |=  (in[13] - base) << 3;
  w3 |=  (in[14] - base) << 18;
  w3 |=  (in[15] - base) << 33;
  w3 |=  (in[16] - base) << 48;
  w3 |= (in[17] - base) << 63;
  w4 = (in[17] - base) >> 1;
  w4 |=  (in[18] - base) << 14;
  w4 |=  (in[19] - base) << 29;
  w4 |=  (in[20] - base) << 44;
  w4 |= (in[21] - base) << 59;
  w5 = (in[21] - base) >> 5;
  w5 |=  (in[22] - base) << 10;
  w5 |=  (in[23] - base) << 25;
  w5 |=  (in[24] - base) << 40;
  w5 |= (in[25] - base) << 55;
  w6 = (in[25] - base) >> 9;
  w6 |=  (in[26] - base) << 6;
  w6 |=  (in[27] - base) << 21;
  w6 |=  (in[28] - base) << 36;
  w6 |= (in[29] - base) << 51;
  w7 = (in[29] - base) >> 13;
  w7 |=  (in[30] - base) << 2;
  w7 |=  (in[31] - base) << 17;
  pw64[0] = w0;
  pw64[1] = w1;
  pw64[2] = w2;
  pw64[3] = w3;
  pw64[4] = w4;
  pw64[5] = w5;
  pw64[6] = w6;
  pw64[7] = w7;
  *pin += 32; /* we consumed 32 64-bit integers */ 
  *pw += 60; /* we used up 60 output bytes */ 
}